

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O1

bool EqualityHelper(Sexp *first,Sexp *second)

{
  Kind KVar1;
  Kind KVar2;
  bool bVar3;
  int iVar4;
  ContractFrame *in_RAX;
  ContractFrameProtector local_28;
  ContractFrameProtector __contract_frame;
  
  local_28.protected_frame = in_RAX;
  ContractFrameProtector::ContractFrameProtector(&local_28,"EqualityHelper");
  ContractFrame::AddContract(local_28.protected_frame,NoGc);
  KVar1 = first->kind;
  if (KVar1 == CONS) {
    if ((second->kind == CONS) &&
       (bVar3 = EqualityHelper((first->field_1).cons.car,(second->field_1).cons.car), bVar3)) {
      if ((first->kind != CONS) || (second->kind != CONS)) {
        __assert_fail("IsCons()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.h"
                      ,0xcd,"Sexp *Sexp::Cdr() const");
      }
      bVar3 = EqualityHelper((first->field_1).cons.cdr,(second->field_1).cons.cdr);
      goto LAB_0011ae81;
    }
  }
  else {
    KVar2 = second->kind;
    if (KVar2 != CONS) {
      if (KVar2 == FIXNUM && KVar1 == FIXNUM) {
        bVar3 = (bool)(-((second->field_1).fixnum_value == (first->field_1).fixnum_value) & 1);
        goto LAB_0011ae81;
      }
      if (KVar2 == SYMBOL && KVar1 == SYMBOL) {
        bVar3 = (first->field_1).cons.car == (second->field_1).cons.car;
        goto LAB_0011ae81;
      }
      if (KVar2 == STRING && KVar1 == STRING) {
        iVar4 = strcmp((first->field_1).string_value,(second->field_1).string_value);
        bVar3 = iVar4 == 0;
        goto LAB_0011ae81;
      }
      if (KVar2 == BOOL && KVar1 == BOOL) {
        bVar3 = (first->field_1).bool_value == (second->field_1).bool_value;
        goto LAB_0011ae81;
      }
      if (first == second) {
        bVar3 = true;
        goto LAB_0011ae81;
      }
    }
  }
  bVar3 = false;
LAB_0011ae81:
  ContractFrameProtector::~ContractFrameProtector(&local_28);
  return bVar3;
}

Assistant:

bool EqualityHelper(Sexp *first, Sexp *second) {
  CONTRACT { FORBID_GC; }